

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O1

SBuf * lj_buf_puttab(SBuf *sb,GCtab *t,GCstr *sep,int32_t i,int32_t e)

{
  uint uVar1;
  uint uVar2;
  uint sz;
  int iVar3;
  cTValue *pcVar4;
  SBuf *sb_00;
  uint32_t uVar5;
  char *pcVar6;
  size_t local_50;
  
  if (sep == (GCstr *)0x0) {
    local_50 = 0;
  }
  else {
    local_50 = (size_t)sep->len;
  }
  if (i <= e) {
    do {
      if ((uint)i < t->asize) {
        pcVar4 = (cTValue *)((ulong)(t->array).ptr32 + (long)i * 8);
      }
      else {
        pcVar4 = lj_tab_getinth(t,i);
      }
      iVar3 = 1;
      uVar5 = i;
      if (pcVar4 != (cTValue *)0x0) {
        sz = (uint)local_50;
        if ((pcVar4->field_2).it == 0xfffffffb) {
          uVar1 = *(uint *)((ulong)(pcVar4->u32).lo + 0xc);
          uVar2 = (sb->p).ptr32;
          pcVar6 = (char *)(ulong)uVar2;
          if ((sb->e).ptr32 - uVar2 < uVar1 + sz) {
            pcVar6 = lj_buf_more2(sb,uVar1 + sz);
          }
          memcpy(pcVar6,(void *)((ulong)(pcVar4->u32).lo + 0x10),(ulong)uVar1);
          pcVar6 = pcVar6 + uVar1;
        }
        else {
          if (0xfffefffe < (pcVar4->field_2).it) goto LAB_00111655;
          sb_00 = lj_strfmt_putfnum(sb,0xf000035,pcVar4->n);
          uVar1 = (sb_00->p).ptr32;
          pcVar6 = (char *)(ulong)uVar1;
          if ((sb_00->e).ptr32 - uVar1 < sz) {
            pcVar6 = lj_buf_more2(sb_00,sz);
          }
        }
        if (i == e) {
          iVar3 = 2;
        }
        else {
          if (sz != 0) {
            memcpy(pcVar6,sep + 1,local_50);
            pcVar6 = pcVar6 + local_50;
          }
          iVar3 = 0;
        }
        uVar5 = (uint32_t)pcVar6;
        i = i + 1;
      }
LAB_00111655:
      (sb->p).ptr32 = uVar5;
    } while (iVar3 == 0);
    if (iVar3 != 2) {
      sb = (SBuf *)0x0;
    }
  }
  return sb;
}

Assistant:

SBuf *lj_buf_puttab(SBuf *sb, GCtab *t, GCstr *sep, int32_t i, int32_t e)
{
  MSize seplen = sep ? sep->len : 0;
  if (i <= e) {
    for (;;) {
      cTValue *o = lj_tab_getint(t, i);
      char *p;
      if (!o) {
      badtype:  /* Error: bad element type. */
	setsbufP(sb, (void *)(intptr_t)i);  /* Store failing index. */
	return NULL;
      } else if (tvisstr(o)) {
	MSize len = strV(o)->len;
	p = lj_buf_wmem(lj_buf_more(sb, len + seplen), strVdata(o), len);
      } else if (tvisint(o)) {
	p = lj_strfmt_wint(lj_buf_more(sb, STRFMT_MAXBUF_INT+seplen), intV(o));
      } else if (tvisnum(o)) {
	p = lj_buf_more(lj_strfmt_putfnum(sb, STRFMT_G14, numV(o)), seplen);
      } else {
	goto badtype;
      }
      if (i++ == e) {
	setsbufP(sb, p);
	break;
      }
      if (seplen) p = lj_buf_wmem(p, strdata(sep), seplen);
      setsbufP(sb, p);
    }
  }
  return sb;
}